

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Cart_map(MPIABI_Comm comm,int ndims,int *dims,int *periods,int *newrank)

{
  int iVar1;
  
  iVar1 = MPI_Cart_map();
  return iVar1;
}

Assistant:

int MPIABI_Cart_map(
  MPIABI_Comm comm,
  int ndims,
  const int * dims,
  const int * periods,
  int * newrank
) {
  return MPI_Cart_map(
    (MPI_Comm)(WPI_Comm)comm,
    ndims,
    dims,
    periods,
    newrank
  );
}